

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRCodecMode.cpp
# Opt level: O1

CodecMode ZXing::QRCode::CodecModeForBits(int bits,Type type)

{
  int iVar1;
  CodecMode in_EAX;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint *local_38;
  long local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (type == rMQR) {
    if (bits < 8) {
      in_EAX = *(CodecMode *)(&DAT_001a0110 + (long)bits * 4);
    }
    bVar5 = SBORROW4(bits,7);
    iVar1 = bits + -7;
    bVar4 = bits == 7;
  }
  else {
    if (type != Micro) {
      if ((uint)bits < 6) {
        return bits;
      }
      uVar3 = bits - 7;
      if ((uVar3 < 7) && ((0x47U >> (uVar3 & 0x1f) & 1) != 0)) {
        return *(CodecMode *)(&DAT_001a00f0 + (ulong)uVar3 * 4);
      }
      goto LAB_0017f36c;
    }
    if (bits < 4) {
      in_EAX = *(CodecMode *)(&DAT_001a0080 + (long)bits * 4);
    }
    bVar5 = SBORROW4(bits,3);
    iVar1 = bits + -3;
    bVar4 = bits == 3;
  }
  if (bVar4 || bVar5 != iVar1 < 0) {
    return in_EAX;
  }
LAB_0017f36c:
  plVar2 = (long *)__cxa_allocate_exception(0x30);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Invalid codec mode","");
  *plVar2 = (long)(plVar2 + 2);
  if (local_38 == &local_28) {
    *(uint *)(plVar2 + 2) = local_28;
    *(undefined4 *)((long)plVar2 + 0x14) = uStack_24;
    *(undefined4 *)(plVar2 + 3) = uStack_20;
    *(undefined4 *)((long)plVar2 + 0x1c) = uStack_1c;
  }
  else {
    *plVar2 = (long)local_38;
    plVar2[2] = CONCAT44(uStack_24,local_28);
  }
  plVar2[1] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  plVar2[4] = (long)"src/qrcode/QRCodecMode.cpp";
  *(undefined2 *)(plVar2 + 5) = 0x24;
  *(undefined1 *)((long)plVar2 + 0x2a) = 1;
  local_38 = &local_28;
  __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

CodecMode CodecModeForBits(int bits, Type type)
{
	if (type == Type::Micro) {
		constexpr CodecMode Bits2Mode[4] = {CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE, CodecMode::KANJI};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else if (type == Type::rMQR) {
		constexpr CodecMode Bits2Mode[8] = {
			CodecMode::TERMINATOR, CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE,
			CodecMode::KANJI, CodecMode::FNC1_FIRST_POSITION, CodecMode::FNC1_SECOND_POSITION, CodecMode::ECI
		};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else {
		if ((bits >= 0x00 && bits <= 0x05) || (bits >= 0x07 && bits <= 0x09) || bits == 0x0d)
			return static_cast<CodecMode>(bits);
	}

	throw FormatError("Invalid codec mode");
}